

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  long lVar1;
  Fts5CResult *pFVar2;
  uint uVar3;
  uint uVar4;
  Fts5SegIter *pFVar5;
  uint uVar6;
  i64 iVar7;
  ulong uVar8;
  Fts5SegIter *pFVar9;
  
  pFVar5 = pIter->aSeg + (uint)iChanged;
  lVar1 = pIter->aSeg[(uint)iChanged].iRowid;
  if (lVar1 == pIter->iSwitchRowid) {
    uVar6 = pIter->bRev;
  }
  else {
    uVar6 = (uint)(lVar1 < pIter->iSwitchRowid);
    if (pIter->bRev != uVar6) goto LAB_001c4cce;
  }
  uVar8 = (ulong)(iChanged ^ 1);
  iVar7 = -0x8000000000000000;
  if (uVar6 == 0) {
    iVar7 = 0x7fffffffffffffff;
  }
  pIter->iSwitchRowid = iVar7;
  pFVar2 = pIter->aFirst;
  uVar4 = iChanged + pIter->nSeg;
  while( true ) {
    uVar3 = (int)uVar4 / 2;
    if (pFVar2[(int)uVar3].bTermEq != '\0') {
      pFVar9 = pIter->aSeg + uVar8;
      lVar1 = pFVar9->iRowid;
      if (pFVar5->iRowid == lVar1) {
        return 1;
      }
      if ((uVar6 == pFVar5->iRowid < lVar1) || (pFVar9 = pFVar5, uVar6 == iVar7 < lVar1)) {
        pFVar5 = pFVar9;
        pIter->iSwitchRowid = lVar1;
        iVar7 = lVar1;
      }
    }
    pFVar2[(int)uVar3].iFirst = (u16)((uint)((int)pFVar5 - (int)pIter->aSeg) >> 7);
    if ((uVar4 & 0xfffffffe) == 2) break;
    uVar8 = (ulong)pFVar2[(int)(uVar3 ^ 1)].iFirst;
    uVar4 = uVar3;
  }
LAB_001c4cce:
  *ppFirst = pFVar5;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}